

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd2copypal.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *pFVar1;
  long lVar2;
  long lVar3;
  
  if (argc == 3) {
    pFVar1 = fopen(argv[1],"rb");
    if (pFVar1 == (FILE *)0x0) goto LAB_0010137f;
    lVar2 = gdImageCreateFromGd2(pFVar1);
    fclose(pFVar1);
    if (lVar2 == 0) goto LAB_00101384;
    pFVar1 = fopen(argv[2],"rb");
    if (pFVar1 == (FILE *)0x0) goto LAB_00101389;
    lVar3 = gdImageCreateFromGd2(pFVar1);
    fclose(pFVar1);
    if (lVar3 != 0) {
      gdImagePaletteCopy(lVar3,lVar2);
      pFVar1 = fopen(argv[2],"wb");
      if (pFVar1 != (FILE *)0x0) {
        gdImageGd2(lVar3,pFVar1,0x80,2);
        fclose(pFVar1);
        gdImageDestroy(lVar2);
        gdImageDestroy(lVar3);
        return 0;
      }
      goto LAB_00101393;
    }
  }
  else {
    main_cold_1();
LAB_0010137f:
    main_cold_6();
LAB_00101384:
    main_cold_5();
LAB_00101389:
    main_cold_4();
  }
  main_cold_3();
LAB_00101393:
  main_cold_2();
  halt_baddata();
}

Assistant:

int
main (int argc, char **argv)
{
	gdImagePtr im;
	gdImagePtr pal;
	FILE *in, *out;
	if (argc != 3) {
		fprintf(stderr, "Usage: gd2copypal palettefile.gd2 filename.gd2\n");
		exit (1);
	}
	in = fopen (argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Palette file does not exist!\n");
		exit (1);
	}
	pal = gdImageCreateFromGd2 (in);
	fclose (in);
	if (!pal) {
		fprintf(stderr, "Palette is not in GD2 format!\n");
		exit (1);
	}

	in = fopen (argv[2], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit (1);
	}
	im = gdImageCreateFromGd2 (in);
	fclose (in);
	if (!im) {
		fprintf(stderr, "Input is not in GD2 format!\n");
		exit (1);
	}

	gdImagePaletteCopy (im, pal);

	out = fopen (argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy (im);
		exit (1);
	}
	gdImageGd2 (im, out, 128, 2);
	fclose (out);
	gdImageDestroy (pal);
	gdImageDestroy (im);

	return 0;
}